

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLURL.cpp
# Opt level: O2

bool xercesc_4_0::XMLURL::parse(XMLCh *urlText,XMLURL *xmlURL)

{
  MemoryManager *manager;
  bool bVar1;
  Protocols PVar2;
  int iVar3;
  XMLCh *pXVar4;
  XMLCh *pXVar5;
  undefined4 extraout_var;
  XMLSize_t XVar6;
  XMLCh *pXVar7;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  long lStack_40;
  ArrayJanitor<char16_t> janSrcCopy;
  
  if (*urlText == L'\0') {
    return false;
  }
  bVar1 = XMLUri::isURIString(urlText);
  xmlURL->fHasInvalidChar = !bVar1;
  if (((ushort)((*urlText & 0xffdfU) - 0x41U) < 0x1a) && (urlText[1] == L':')) {
    if (urlText[2] == L'/') {
      return false;
    }
    if (urlText[2] == L'\\') {
      return false;
    }
  }
  pXVar4 = XMLString::replicate(urlText,xmlURL->fMemoryManager);
  ArrayJanitor<char16_t>::ArrayJanitor(&janSrcCopy,pXVar4,xmlURL->fMemoryManager);
  while( true ) {
    if ((ulong)(ushort)*pXVar4 == 0) goto LAB_0026d09d;
    if (-1 < (char)(&XMLChar1_0::fgCharCharsTable1_0)[(ushort)*pXVar4]) break;
    pXVar4 = pXVar4 + 1;
  }
  pXVar5 = XMLString::findAny(pXVar4,L":/");
  if ((pXVar5 != (XMLCh *)0x0) && (*pXVar5 == L':')) {
    *pXVar5 = L'\0';
    PVar2 = lookupByName(pXVar4);
    xmlURL->fProtocol = PVar2;
    if (PVar2 == Unknown) goto LAB_0026d09d;
    pXVar4 = pXVar5 + 1;
  }
  if ((*pXVar4 != L'/') || (pXVar4[1] != L'/')) {
    pXVar5 = pXVar4;
    if (xmlURL->fProtocol != HTTP) goto LAB_0026cfd8;
    goto LAB_0026d09d;
  }
  pXVar5 = pXVar4 + 2;
  if (pXVar4[2] != L'\0') {
    pXVar4 = XMLString::findAny(pXVar5,L"/");
    if (pXVar4 == (XMLCh *)0x0) {
      pXVar4 = XMLString::replicate(pXVar5,xmlURL->fMemoryManager);
      xmlURL->fHost = pXVar4;
      XVar6 = XMLString::stringLen(pXVar4);
      pXVar5 = pXVar5 + XVar6;
    }
    else if ((long)pXVar4 - (long)pXVar5 != 0) {
      iVar3 = (*xmlURL->fMemoryManager->_vptr_MemoryManager[3])
                        (xmlURL->fMemoryManager,((long)pXVar4 - (long)pXVar5) + 2);
      pXVar7 = (XMLCh *)CONCAT44(extraout_var,iVar3);
      xmlURL->fHost = pXVar7;
      for (; pXVar5 < pXVar4; pXVar5 = pXVar5 + 1) {
        *pXVar7 = *pXVar5;
        pXVar7 = pXVar7 + 1;
      }
      *pXVar7 = L'\0';
    }
  }
LAB_0026cfd8:
  if (xmlURL->fHost == (XMLCh *)0x0) {
LAB_0026d0c5:
    if (*pXVar5 != L'\0') {
LAB_0026d0d0:
      pXVar4 = XMLString::findAny(pXVar5,L"#?");
      if (pXVar4 == (XMLCh *)0x0) goto LAB_0026d117;
      if (pXVar5 <= pXVar4 && (long)pXVar4 - (long)pXVar5 != 0) {
        iVar3 = (*xmlURL->fMemoryManager->_vptr_MemoryManager[3])
                          (xmlURL->fMemoryManager,((long)pXVar4 - (long)pXVar5) + 2);
        pXVar7 = (XMLCh *)CONCAT44(extraout_var_00,iVar3);
        xmlURL->fPath = pXVar7;
        for (; pXVar5 < pXVar4; pXVar5 = pXVar5 + 1) {
          *pXVar7 = *pXVar5;
          pXVar7 = pXVar7 + 1;
        }
        *pXVar7 = L'\0';
      }
      pXVar4 = pXVar5 + 1;
      if (*pXVar5 != L'#') {
        pXVar5 = XMLString::findAny(pXVar4,L"#");
        manager = xmlURL->fMemoryManager;
        if (pXVar5 == (XMLCh *)0x0) {
          pXVar4 = XMLString::replicate(pXVar4,manager);
          lStack_40 = 0x38;
          goto LAB_0026d1b4;
        }
        iVar3 = (*manager->_vptr_MemoryManager[3])(manager,(long)pXVar5 + (2 - (long)pXVar4));
        pXVar7 = (XMLCh *)CONCAT44(extraout_var_01,iVar3);
        xmlURL->fQuery = pXVar7;
        for (; pXVar4 < pXVar5; pXVar4 = pXVar4 + 1) {
          *pXVar7 = *pXVar4;
          pXVar7 = pXVar7 + 1;
        }
        *pXVar7 = L'\0';
        bVar1 = true;
        if (*pXVar4 != L'#') goto LAB_0026d09f;
        pXVar4 = pXVar4 + 1;
      }
      pXVar4 = XMLString::replicate(pXVar4,xmlURL->fMemoryManager);
      lStack_40 = 0x10;
      goto LAB_0026d1b4;
    }
  }
  else {
    pXVar4 = XMLString::findAny(xmlURL->fHost,L"@");
    if (pXVar4 != (XMLCh *)0x0) {
      *pXVar4 = L'\0';
      pXVar7 = XMLString::replicate(xmlURL->fHost,xmlURL->fMemoryManager);
      xmlURL->fUser = pXVar7;
      XMLString::cut(xmlURL->fHost,(long)pXVar4 + (2 - (long)xmlURL->fHost) >> 1);
      pXVar4 = XMLString::findAny(xmlURL->fUser,L":");
      if (pXVar4 != (XMLCh *)0x0) {
        *pXVar4 = L'\0';
        pXVar4 = XMLString::replicate(pXVar4 + 1,xmlURL->fMemoryManager);
        xmlURL->fPassword = pXVar4;
      }
    }
    pXVar4 = XMLString::findAny(xmlURL->fHost,L":");
    if (pXVar4 != (XMLCh *)0x0) {
      *pXVar4 = L'\0';
      bVar1 = XMLString::textToBin(pXVar4 + 1,&xmlURL->fPortNum,xmlURL->fMemoryManager);
      if (!bVar1) {
LAB_0026d09d:
        bVar1 = false;
        goto LAB_0026d09f;
      }
    }
    if (*xmlURL->fHost == L'\0') {
      (*xmlURL->fMemoryManager->_vptr_MemoryManager[4])();
      xmlURL->fHost = (XMLCh *)0x0;
      goto LAB_0026d0c5;
    }
    if (*pXVar5 != L'\0') goto LAB_0026d0d0;
    pXVar5 = L"/";
LAB_0026d117:
    pXVar4 = XMLString::replicate(pXVar5,xmlURL->fMemoryManager);
    lStack_40 = 0x28;
LAB_0026d1b4:
    *(XMLCh **)((long)&xmlURL->_vptr_XMLURL + lStack_40) = pXVar4;
  }
  bVar1 = true;
LAB_0026d09f:
  ArrayJanitor<char16_t>::~ArrayJanitor(&janSrcCopy);
  return bVar1;
}

Assistant:

bool XMLURL::parse(const XMLCh* const urlText, XMLURL& xmlURL)
{
    // Simplify things by checking for the psycho scenarios first
    if (!*urlText)
        return false;

    // Before we start, check if this urlText contains valid uri characters
    if (!XMLUri::isURIString(urlText))
        xmlURL.fHasInvalidChar = true;
    else
        xmlURL.fHasInvalidChar = false;

    //
    //  The first thing we will do is to check for a file name, so that
    //  we don't waste time thinking its a URL. If its in the form x:\ or x:/
    //  and x is an ASCII letter, then assume that's the deal.
    //
    if (((*urlText >= chLatin_A) && (*urlText <= chLatin_Z))
    ||  ((*urlText >= chLatin_a) && (*urlText <= chLatin_z)))
    {
        if (*(urlText + 1) == chColon)
        {
            if ((*(urlText + 2) == chForwardSlash)
            ||  (*(urlText + 2) == chBackSlash))
            {
                return false;
            }
        }
    }

    // Get a copy of the URL that we can modify
    XMLCh* srcCpy = XMLString::replicate(urlText, xmlURL.fMemoryManager);
    ArrayJanitor<XMLCh> janSrcCopy(srcCpy, xmlURL.fMemoryManager);

    //
    //  Get a pointer now that we can run up thrown the source as we parse
    //  bits and pieces out of it.
    //
    XMLCh* srcPtr = srcCpy;

    // Run up past any spaces
    while (*srcPtr)
    {
        if (!XMLChar1_0::isWhitespace(*srcPtr))
            break;
        srcPtr++;
    }

    // Make sure it wasn't all space
    if (!*srcPtr)
        return false;

    //
    //  Ok, the next thing we have to do is to find either a / or : character.
    //  If the : is first, we assume we have a protocol. If the / is first,
    //  then we skip to the host processing.
    //
    XMLCh* ptr1 = XMLString::findAny(srcPtr, gListOne);
    XMLCh* ptr2;

    // If we found a protocol, then deal with it
    if (ptr1)
    {
        if (*ptr1 == chColon)
        {
            // Cap the string at the colon
            *ptr1 = 0;

            // And try to find it in our list of protocols
            xmlURL.fProtocol = lookupByName(srcPtr);

            if (xmlURL.fProtocol == Unknown)
                return false;

            // And move our source pointer up past what we've processed
            srcPtr = (ptr1 + 1);
        }
    }

    //
    //  Ok, next we need to see if we have any host part. If the next
    //  two characters are //, then we need to check, else move on.
    //
    if ((*srcPtr == chForwardSlash) && (*(srcPtr + 1) == chForwardSlash))
    {
        // Move up past the slashes
        srcPtr += 2;

        //
        //  If we aren't at the end of the string, then there has to be a
        //  host part at this point. we will just look for the next / char
        //  or end of string and make all of that the host for now.
        //
        if (*srcPtr)
        {
            // Search from here for a / character
            ptr1 = XMLString::findAny(srcPtr, gListFour);

            //
            //  If we found something, then the host is between where
            //  we are and what we found. Else the host is the rest of
            //  the content and we are done. If its empty, leave it null.
            //
            if (ptr1)
            {
                if (ptr1 != srcPtr)
                {
                    xmlURL.fHost = (XMLCh*) xmlURL.fMemoryManager->allocate
                    (
                        ((ptr1 - srcPtr) + 1) * sizeof(XMLCh)
                    );//new XMLCh[(ptr1 - srcPtr) + 1];
                    ptr2 = xmlURL.fHost;
                    while (srcPtr < ptr1)
                        *ptr2++ = *srcPtr++;
                    *ptr2 = 0;
                }
            }
             else
            {
                xmlURL.fHost = XMLString::replicate(srcPtr, xmlURL.fMemoryManager);

                // Update source pointer to the end
                srcPtr += XMLString::stringLen(xmlURL.fHost);
            }
        }
    }
    else
    {
        //
        // http protocol requires two forward slashes
        // we didn't get them, so throw an exception
        //
        if (xmlURL.fProtocol == HTTP)
            return false;
    }

    //
    //  If there was a host part, then we have to grovel through it for
    //  all the bits and pieces it can hold.
    //
    if (xmlURL.fHost)
    {
        //
        //  Look for a '@' character, which indicates a user name. If we
        //  find one, then everything between the start of the host data
        //  and the character is the user name.
        //
        ptr1 = XMLString::findAny(xmlURL.fHost, gListTwo);
        if (ptr1)
        {
            // Get this info out as the user name
            *ptr1 = 0;
            xmlURL.fUser = XMLString::replicate(xmlURL.fHost, xmlURL.fMemoryManager);
            ptr1++;

            // And now cut these chars from the host string
            XMLString::cut(xmlURL.fHost, ptr1 - xmlURL.fHost);

            // Is there a password inside the user string?
            ptr2 = XMLString::findAny(xmlURL.fUser, gListThree);
            if (ptr2)
            {
                // Remove it from the user name string
                *ptr2 = 0;

                // And copy out the remainder to the password field
                ptr2++;
                xmlURL.fPassword = XMLString::replicate(ptr2, xmlURL.fMemoryManager);
            }
        }

        //
        //  Ok, so now we are at the actual host name, if any. If we are
        //  not at the end of the host data, then lets see if we have a
        //  port trailing the
        //
        ptr1 = XMLString::findAny(xmlURL.fHost, gListThree);
        if (ptr1)
        {
            // Remove it from the host name
            *ptr1 = 0;

            // Try to convert it to a numeric port value and store it
            ptr1++;
            if (!XMLString::textToBin(ptr1, xmlURL.fPortNum, xmlURL.fMemoryManager))
                return false;
        }

        // If the host ended up empty, then toss is
        if (!*(xmlURL.fHost))
        {
            xmlURL.fMemoryManager->deallocate(xmlURL.fHost);//delete[] fHost;
            xmlURL.fHost = 0;
        }
    }

    // If we are at the end, then we are done now
    if (!*srcPtr) {
        if(xmlURL.fHost) {
            static const XMLCh slash[] = { chForwardSlash, chNull };
            xmlURL.fPath = XMLString::replicate(slash, xmlURL.fMemoryManager);
        }
        return true;
    }

    //
    //  Next is the path part. It can be absolute, i.e. starting with a
    //  forward slash character, or relative. Its basically everything up
    //  to the end of the string or to any trailing query or fragment.
    //
    ptr1 = XMLString::findAny(srcPtr, gListFive);
    if (!ptr1)
    {
        xmlURL.fPath = XMLString::replicate(srcPtr, xmlURL.fMemoryManager);
        return true;
    }

    // Everything from where we are to what we found is the path
    if (ptr1 > srcPtr)
    {
        xmlURL.fPath = (XMLCh*) xmlURL.fMemoryManager->allocate
        (
            ((ptr1 - srcPtr) + 1) * sizeof(XMLCh)
        );//new XMLCh[(ptr1 - srcPtr) + 1];
        ptr2 = xmlURL.fPath;
        while (srcPtr < ptr1)
            *ptr2++ = *srcPtr++;
        *ptr2 = 0;
    }

    //
    //  If we found a fragment, then it is the rest of the string and we
    //  are done.
    //
    if (*srcPtr == chPound)
    {
        srcPtr++;
        xmlURL.fFragment = XMLString::replicate(srcPtr, xmlURL.fMemoryManager);
        return true;
    }

    //
    //  The query is either the rest of the string, or up to the fragment
    //  separator.
    //
    srcPtr++;
    ptr1 = XMLString::findAny(srcPtr, gListSix);
    if (!ptr1)
    {
        xmlURL.fQuery = XMLString::replicate(srcPtr, xmlURL.fMemoryManager);
        return true;
    }
     else
    {
        xmlURL.fQuery = (XMLCh*) xmlURL.fMemoryManager->allocate
        (
            ((ptr1 - srcPtr) + 1) * sizeof(XMLCh)
        );//new XMLCh[(ptr1 - srcPtr) + 1];
        ptr2 = xmlURL.fQuery;
        while (srcPtr < ptr1)
            *ptr2++ = *srcPtr++;
        *ptr2 = 0;
    }

    // If we are not at the end now, then everything else is the fragment
    if (*srcPtr == chPound)
    {
        srcPtr++;
        xmlURL.fFragment = XMLString::replicate(srcPtr, xmlURL.fMemoryManager);
    }

    return true;
}